

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O3

vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
* __thiscall
optimization::loop_unrolling::Rewriter::get_insts
          (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           *__return_storage_ptr__,Rewriter *this,int times,VarId *new_change_var)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  pointer puVar3;
  VarId *pVVar4;
  Inst *pIVar5;
  BasicBlk *pBVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  _Var9;
  uint32_t *puVar10;
  mapped_type *pmVar11;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var12;
  size_type sVar13;
  _Base_ptr p_Var14;
  long lVar15;
  ulong uVar16;
  _Base_ptr p_Var17;
  pointer *__ptr;
  pointer puVar18;
  Inst *pIVar19;
  _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
  *this_00;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var20;
  VarId var;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_f8;
  int local_f0;
  uint32_t local_ec;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_e8;
  _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
  *local_e0;
  int local_d4;
  uint32_t local_d0;
  uint32_t local_cc;
  _func_int **local_c8;
  VarId *local_c0;
  undefined1 local_b8 [24];
  _Rb_tree_node_base *local_a0;
  _Base_ptr local_88;
  VarId *local_80;
  Displayable local_78;
  undefined **local_70;
  uint32_t local_68;
  undefined **local_60;
  uint32_t local_58;
  undefined **local_50;
  uint local_48;
  key_type local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)__return_storage_ptr__;
  if (times < 1) {
    local_ec = 0;
  }
  else {
    this_00 = (_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
               *)&this->var_map;
    local_88 = (_Base_ptr)&this->phi_var_pair;
    p_Var1 = &(this->var_map)._M_t._M_impl.super__Rb_tree_header;
    local_80 = &this->change_var;
    local_c8 = (_func_int **)&PTR_display_001ed3a8;
    iVar7 = 0;
    local_ec = 0;
    local_e0 = this_00;
    local_d4 = times;
    local_c0 = new_change_var;
    do {
      std::
      _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
      ::clear((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
               *)this_00);
      local_f0 = iVar7;
      if (iVar7 != 0) {
        std::
        _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
        ::_M_emplace_unique<std::pair<mir::inst::VarId,mir::inst::VarId>&>
                  (this_00,(pair<mir::inst::VarId,_mir::inst::VarId> *)local_88);
      }
      puVar18 = (this->blk->inst).
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->blk->inst).
               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = local_e0;
      iVar7 = local_f0;
      if (puVar18 != puVar3) {
        do {
          iVar7 = (*(((puVar18->_M_t).
                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                    super_Displayable)._vptr_Displayable[1])();
          if (iVar7 != 4) {
            local_70 = &PTR_display_001eb100;
            local_68 = (((puVar18->_M_t).
                         super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                         .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id;
            copy_var((Rewriter *)local_b8,(VarId *)this);
          }
          puVar18 = puVar18 + 1;
        } while (puVar18 != puVar3);
        puVar18 = (this->blk->inst).
                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_78._vptr_Displayable =
             (_func_int **)
             (this->blk->inst).
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        this_00 = local_e0;
        iVar7 = local_f0;
        if (puVar18 != (pointer)local_78._vptr_Displayable) {
          do {
            iVar8 = (*(((puVar18->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                      super_Displayable)._vptr_Displayable[1])();
            if (iVar8 == 7) {
              if (iVar7 == 0) {
                local_b8._0_4_ =
                     (*(((puVar18->_M_t).
                         super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                         .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                       super_Displayable)._vptr_Displayable[6])();
                local_b8._4_4_ = extraout_var;
                _Var20._M_head_impl = (Inst *)local_b8._0_8_;
                if (*(_func_int ***)local_b8._0_8_ != local_c8) {
                  _Var20._M_head_impl = (Inst *)0x0;
                }
                _Var9 = std::
                        __find_if<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_equals_val<mir::inst::VarId_const>>
                                  ((((shared_ptr<mir::types::FunctionTy> *)
                                    ((long)_Var20._M_head_impl + 0x28))->
                                   super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr,((_Var20._M_head_impl + 0x30)->super_Displayable).
                                            _vptr_Displayable,local_80);
                pVVar4 = (VarId *)((_Var20._M_head_impl + 0x30)->super_Displayable).
                                  _vptr_Displayable;
                if ((_Var9._M_current + 1 != pVVar4) &&
                   (lVar15 = (long)pVVar4 - (long)(_Var9._M_current + 1) >> 4, 0 < lVar15)) {
                  uVar16 = lVar15 + 1;
                  puVar10 = &_Var9._M_current[1].id;
                  do {
                    puVar10[-4] = *puVar10;
                    uVar16 = uVar16 - 1;
                    puVar10 = puVar10 + 4;
                  } while (1 < uVar16);
                }
                ((_Var20._M_head_impl + 0x30)->super_Displayable)._vptr_Displayable =
                     (_func_int **)(pVVar4 + -1);
                pmVar11 = std::
                          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                          ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                *)this_00,(key_type *)(local_b8._0_8_ + 8));
                *(uint32_t *)(local_b8._0_8_ + 0x10) = pmVar11->id;
                std::
                vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                ::
                emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                          (local_e8,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                     *)local_b8);
                _Var20._M_head_impl = (Inst *)local_b8._0_8_;
                iVar7 = local_f0;
                goto joined_r0x00156c5a;
              }
            }
            else {
              iVar7 = (*(((puVar18->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                        super_Displayable)._vptr_Displayable[6])();
              local_f8._M_head_impl = (Inst *)CONCAT44(extraout_var_00,iVar7);
              local_cc = (((puVar18->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id;
              local_d0 = (this->change_var).id;
              (*((local_f8._M_head_impl)->super_Displayable)._vptr_Displayable[2])
                        (local_b8,local_f8._M_head_impl);
              for (p_Var12 = local_a0; _Var20._M_head_impl = local_f8._M_head_impl,
                  p_Var12 != (_Rb_tree_node_base *)(local_b8 + 8);
                  p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
                local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
                local_40.id = *(uint32_t *)&p_Var12[1]._M_parent;
                p_Var14 = (this->var_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var17 = &p_Var1->_M_header;
                if (p_Var14 != (_Base_ptr)0x0) {
                  do {
                    if (*(uint *)((long)(p_Var14 + 1) + 8) >= local_40.id) {
                      p_Var17 = p_Var14;
                    }
                    p_Var14 = (&p_Var14->_M_left)[*(uint *)((long)(p_Var14 + 1) + 8) < local_40.id];
                  } while (p_Var14 != (_Base_ptr)0x0);
                  if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
                     (*(uint *)((long)p_Var17 + 0x28) <= local_40.id)) {
                    local_50 = &PTR_display_001eb100;
                    local_48 = local_40.id;
                    pmVar11 = std::
                              map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                              ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                    *)local_e0,&local_40);
                    local_60 = &PTR_display_001eb100;
                    local_58 = pmVar11->id;
                    (*((_Var20._M_head_impl)->super_Displayable)._vptr_Displayable[3])
                              (_Var20._M_head_impl,&local_50,&local_60);
                  }
                }
              }
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)local_b8);
              this_00 = local_e0;
              sVar13 = std::
                       map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                       ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                *)local_e0,&(local_f8._M_head_impl)->dest);
              iVar7 = local_f0;
              if (sVar13 != 0) {
                pmVar11 = std::
                          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                          ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                *)this_00,&(local_f8._M_head_impl)->dest);
                ((local_f8._M_head_impl)->dest).id = pmVar11->id;
              }
              if (local_cc == local_d0) {
                uVar2 = ((local_f8._M_head_impl)->dest).id;
                local_c0->id = uVar2;
                (this->phi_var_pair).second.id = uVar2;
              }
              iVar8 = (*(((puVar18->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                        super_Displayable)._vptr_Displayable[1])();
              if ((iVar8 == 1) &&
                 ((puVar18->_M_t).
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl[3].dest.id == 7)) {
                local_ec = ((local_f8._M_head_impl)->dest).id;
              }
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_e8,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   *)&local_f8);
              _Var20._M_head_impl = local_f8._M_head_impl;
joined_r0x00156c5a:
              if ((_Head_base<0UL,_mir::inst::Inst_*,_false>)_Var20._M_head_impl !=
                  (_Head_base<0UL,_mir::inst::Inst_*,_false>)0x0) {
                (*((_Var20._M_head_impl)->super_Displayable)._vptr_Displayable[5])();
              }
            }
            puVar18 = puVar18 + 1;
          } while (puVar18 != (pointer)local_78._vptr_Displayable);
        }
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != local_d4);
    puVar18 = *(pointer *)local_e8;
    if (*(pointer *)(local_e8 + 8) != puVar18) {
      iVar7 = (*(((puVar18->_M_t).
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
                _vptr_Displayable[1])();
      if (iVar7 != 7) {
        __assert_fail("inst->inst_kind() == mir::inst::InstKind::Phi",
                      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
                      ,0x5d,
                      "std::vector<std::unique_ptr<mir::inst::Inst>> optimization::loop_unrolling::Rewriter::get_insts(int, mir::inst::VarId &)"
                     );
      }
      pIVar5 = (puVar18->_M_t).
               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      pIVar19 = (Inst *)0x0;
      if ((pIVar5->super_Displayable)._vptr_Displayable == local_c8) {
        pIVar19 = pIVar5;
      }
      local_b8._8_4_ = local_c0->id;
      local_b8._0_8_ = &PTR_display_001eb100;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
      emplace_back<mir::inst::VarId>
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&pIVar19[1].dest.id,
                 (VarId *)local_b8);
    }
  }
  pBVar6 = this->blk;
  if ((pBVar6->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
    (pBVar6->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
    _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    (pBVar6->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
  }
  (pBVar6->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
  super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = local_ec;
  return (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          *)local_e8;
}

Assistant:

std::vector<std::unique_ptr<mir::inst::Inst>> get_insts(
      int times, mir::inst::VarId& new_change_var) {
    std::vector<std::unique_ptr<mir::inst::Inst>> res;
    auto cond = mir::inst::VarId(0);
    for (int i = 0; i < times; i++) {
      var_map.clear();
      if (i) {
        var_map.insert(phi_var_pair);
      }
      for (auto& inst : blk.inst) {
        if (inst->inst_kind() != mir::inst::InstKind::Store) {
          copy_var(inst->dest);
        }
      }
      for (auto& inst : blk.inst) {
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          if (i == 0) {
            auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
            auto& i = *ptr;
            auto phi = dynamic_cast<mir::inst::PhiInst*>(&i);
            phi->vars.erase(
                std::find(phi->vars.begin(), phi->vars.end(), change_var));
            ptr->dest = var_map.at(ptr->dest);
            res.push_back(std::move(ptr));
          }
          continue;
        } else {
          auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
          bool flag = inst->dest == change_var;
          for (auto var : ptr->useVars()) {
            if (var_map.count(var)) ptr->replace(var, var_map.at(var));
          }
          if (var_map.count(ptr->dest)) {
            ptr->dest = var_map.at(ptr->dest);
          }
          if (flag) {
            new_change_var = ptr->dest;
            phi_var_pair.second = ptr->dest;
          }
          if (inst->inst_kind() == mir::inst::InstKind::Op) {
            auto& i = *inst;
            auto opist = dynamic_cast<mir::inst::OpInst*>(&i);
            if (opist->op == mir::inst::Op::Lt) {
              cond = ptr->dest;
            }
          }
          res.push_back(std::move(ptr));
        }
      }
    }
    if (res.size()) {
      auto& inst = res.front();
      assert(inst->inst_kind() == mir::inst::InstKind::Phi);
      auto& i = *inst;
      auto phi = dynamic_cast<mir::inst::PhiInst*>(&i);
      phi->vars.push_back(mir::inst::VarId(new_change_var.id));
    }
    blk.jump.cond_or_ret = cond;
    return res;
  }